

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_without_glx.c
# Opt level: O3

EGLint override_eglGetError(void)

{
  EGLint EVar1;
  undefined8 uVar2;
  code *UNRECOVERED_JUMPTABLE;
  
  uVar2 = dlopen("libEGL.so.1",1);
  UNRECOVERED_JUMPTABLE = (code *)dlsym(uVar2,"eglGetError");
  if (extra_error == '\x01') {
    extra_error = 0;
    return 0x300c;
  }
  if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
    EVar1 = (*UNRECOVERED_JUMPTABLE)();
    return EVar1;
  }
  __assert_fail("real_eglGetError",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mgba-emu[P]libepoxy/test/egl_without_glx.c"
                ,0x56,"EGLint override_eglGetError(void)");
}

Assistant:

static EGLint
override_eglGetError(void)
{
    void *egl = dlopen("libEGL.so.1", RTLD_LAZY | RTLD_LOCAL);
    EGLint (*real_eglGetError)(void) = dlsym(egl, "eglGetError");

    if (extra_error != EGL_SUCCESS) {
        EGLenum error = extra_error;
        extra_error = EGL_SUCCESS;
        return error;
    }

    assert(real_eglGetError);
    return real_eglGetError();
}